

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontEffect.cpp
# Opt level: O1

void Rml::FontEffect::FillColorValuesFromAlpha(byte *destination,Vector2i dimensions,int stride)

{
  byte bVar1;
  byte *pbVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (0 < dimensions.y) {
    pbVar2 = destination + 3;
    uVar3 = 0;
    do {
      if (0 < dimensions.x) {
        uVar4 = 0;
        do {
          bVar1 = pbVar2[uVar4 * 4];
          pbVar2[uVar4 * 4 + -1] = bVar1;
          pbVar2[uVar4 * 4 + -2] = bVar1;
          pbVar2[uVar4 * 4 + -3] = bVar1;
          uVar4 = uVar4 + 1;
        } while ((dimensions.x & 0x7fffffff) != uVar4);
      }
      uVar3 = uVar3 + 1;
      pbVar2 = pbVar2 + stride;
    } while (uVar3 != (ulong)dimensions >> 0x20);
  }
  return;
}

Assistant:

void FontEffect::FillColorValuesFromAlpha(byte* destination, Vector2i dimensions, int stride)
{
	for (int y = 0; y < dimensions.y; ++y)
	{
		for (int x = 0; x < dimensions.x; ++x)
		{
			const int i = y * stride + x * 4;
			const byte alpha = destination[i + 3];
			destination[i + 0] = destination[i + 1] = destination[i + 2] = alpha;
		}
	}
}